

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWriterTests.cpp
# Opt level: O0

int testFileWriterTestsOffsetNotAligned(void)

{
  initializer_list<unsigned_char> __l;
  string *filePath;
  ostream *poVar1;
  SpanSize<18446744073709551615UL> extraout_RDX;
  bool bVar2;
  Span<unsigned_char,_18446744073709551615UL> span;
  Span<unsigned_char,_18446744073709551615UL> SVar3;
  runtime_error *ex;
  Span<unsigned_char,_18446744073709551615UL> local_2c8;
  Span<const_unsigned_char,_18446744073709551615UL> local_2b8;
  byte local_2a1;
  undefined1 local_2a0 [7];
  bool caughtCorrectException;
  FileWriter writer;
  Span<unsigned_char,_18446744073709551615UL> expectedSpan;
  allocator<unsigned_char> local_6d;
  uchar local_6c [4];
  iterator local_68;
  size_type local_60;
  undefined1 local_58 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> expected;
  uint64_t offset;
  AutoDeleteTempFile tempfile;
  
  MILBlob::TestUtil::AutoDeleteTempFile::AutoDeleteTempFile((AutoDeleteTempFile *)&offset);
  expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x3;
  builtin_memcpy(local_6c,"\n\x14\x1e(",4);
  local_68 = local_6c;
  local_60 = 4;
  std::allocator<unsigned_char>::allocator(&local_6d);
  __l._M_len = local_60;
  __l._M_array = local_68;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58,__l,&local_6d);
  std::allocator<unsigned_char>::~allocator(&local_6d);
  SVar3 = MILBlob::Util::MakeSpan<unsigned_char,_std::vector,_std::allocator<unsigned_char>_>
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
  writer._520_8_ = SVar3.m_ptr;
  filePath = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_
                       ((AutoDeleteTempFile *)&offset);
  MILBlob::Blob::FileWriter::FileWriter((FileWriter *)local_2a0,filePath,true);
  local_2a1 = 0;
  span.m_size.m_size = extraout_RDX.m_size;
  span.m_ptr = (pointer)SVar3.m_size.m_size.m_size;
  local_2c8 = MILBlob::Util::SpanCast<unsigned_char,unsigned_char>((Util *)writer._520_8_,span);
  MILBlob::Util::Span<const_unsigned_char,_18446744073709551615UL>::Span<unsigned_char,_0>
            (&local_2b8,&local_2c8);
  MILBlob::Blob::FileWriter::WriteData
            ((FileWriter *)local_2a0,local_2b8,
             (uint64_t)
             expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  bVar2 = (local_2a1 & 1) != 0;
  if (!bVar2) {
    poVar1 = std::operator<<((ostream *)&std::clog,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/FileWriterTests.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x8b);
    std::operator<<(poVar1,": expected exception, but none thrown.\n");
    tempfile._36_4_ = 1;
  }
  MILBlob::Blob::FileWriter::~FileWriter((FileWriter *)local_2a0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
  if (bVar2) {
    tempfile._36_4_ = 0;
  }
  MILBlob::TestUtil::AutoDeleteTempFile::~AutoDeleteTempFile((AutoDeleteTempFile *)&offset);
  return tempfile._36_4_;
}

Assistant:

int testFileWriterTestsOffsetNotAligned()
{
    AutoDeleteTempFile tempfile;
    // Writing to empty file
    {
        uint64_t offset = 3;
        std::vector<uint8_t> expected{10, 20, 30, 40};
        auto expectedSpan = Util::MakeSpan(expected);

        FileWriter writer(tempfile.GetFilename(), /* truncateFile */ true);
        ML_ASSERT_THROWS_WITH_MESSAGE(writer.WriteData(Util::SpanCast<uint8_t>(expectedSpan), offset),
                                      std::runtime_error,
                                      "Provided offset not aligned.");
    }

    return 0;
}